

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

DescriptorProto * __thiscall
google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::Add
          (RepeatedPtrField<google::protobuf::DescriptorProto> *this)

{
  Type *pTVar1;
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_local;
  
  pTVar1 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                     ((RepeatedPtrFieldBase *)this);
  return pTVar1;
}

Assistant:

inline Element* RepeatedPtrField<Element>::Add() {
  return RepeatedPtrFieldBase::Add<TypeHandler>();
}